

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.cc
# Opt level: O0

int __thiscall fmt::v7::file::close(file *this,int __fd)

{
  int error_code;
  system_error *this_00;
  int *piVar1;
  string_view local_28;
  int local_14;
  file *pfStack_10;
  int result;
  file *this_local;
  
  if (this->fd_ != -1) {
    pfStack_10 = this;
    local_14 = ::close(this->fd_);
    this->fd_ = -1;
    if (local_14 != 0) {
      this_00 = (system_error *)__cxa_allocate_exception(0x18);
      piVar1 = __errno_location();
      error_code = *piVar1;
      basic_string_view<char>::basic_string_view(&local_28,"cannot close file");
      system_error::system_error<>(this_00,error_code,local_28);
      __cxa_throw(this_00,&system_error::typeinfo,system_error::~system_error);
    }
  }
  return (int)this;
}

Assistant:

void file::close() {
  if (fd_ == -1) return;
  // Don't retry close in case of EINTR!
  // See http://linux.derkeiler.com/Mailing-Lists/Kernel/2005-09/3000.html
  int result = FMT_POSIX_CALL(close(fd_));
  fd_ = -1;
  if (result != 0) FMT_THROW(system_error(errno, "cannot close file"));
}